

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O0

ssize_t __thiscall
ApprovalTests::StringWriter::write(StringWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  char *pcVar2;
  runtime_error *this_00;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  StringWriter *this_01;
  ofstream out;
  ostream *in_stack_fffffffffffffd98;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  long local_210 [64];
  StringWriter *local_10;
  StringWriter *local_8;
  
  this_01 = (StringWriter *)CONCAT44(in_register_00000034,__fd);
  local_10 = this_01;
  local_8 = this;
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  ::std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = ::std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    Write(this_01,in_stack_fffffffffffffd98);
    ::std::ofstream::close();
    sVar3 = ::std::ofstream::~ofstream(local_210);
    return sVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  ::std::runtime_error::runtime_error(this_00,local_240);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StringWriter::write(std::string path) const
    {
        std::ofstream out(path.c_str(), std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + path);
        }
        this->Write(out);
        out.close();
    }